

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateSmallDenseSeeds.cpp
# Opt level: O0

void FillTables(void)

{
  memcpy(kTinyDenseCounts,wirehair::kTinyDenseCounts,0x41);
  memcpy(kTinyDenseSeeds,wirehair::kTinyDenseSeeds,0x82);
  memcpy(kSmallDenseSeeds,wirehair::kSmallDenseSeeds,0x7bf);
  memcpy(kSmallPeelSeeds,wirehair::kSmallPeelSeeds,0x800);
  return;
}

Assistant:

void FillTables()
{
    memcpy(kTinyDenseCounts, wirehair::kTinyDenseCounts, sizeof(kTinyDenseCounts));
    memcpy(kTinyDenseSeeds, wirehair::kTinyDenseSeeds, sizeof(kTinyDenseSeeds));
    memcpy(kSmallDenseSeeds, wirehair::kSmallDenseSeeds, sizeof(kSmallDenseSeeds));
    memcpy(kSmallPeelSeeds, wirehair::kSmallPeelSeeds, sizeof(kSmallPeelSeeds));
}